

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::originalParam
          (TGlslangToSpvTraverser *this,TStorageQualifier qualifier,TType *paramType,
          bool implicitThisParam)

{
  bool bVar1;
  EShSource EVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  bool local_3a;
  bool local_39;
  bool implicitThisParam_local;
  TType *paramType_local;
  TStorageQualifier qualifier_local;
  TGlslangToSpvTraverser *this_local;
  
  if (implicitThisParam) {
    return true;
  }
  EVar2 = glslang::TIntermediate::getSource(this->glslangIntermediate);
  if (EVar2 != EShSourceHlsl) {
    uVar4 = (*paramType->_vptr_TType[0x36])();
    if (((uVar4 & 1) != 0) &&
       (bVar1 = glslang::TIntermediate::getBindlessMode(this->glslangIntermediate), !bVar1)) {
      return true;
    }
    iVar3 = (*paramType->_vptr_TType[0xb])();
    bVar1 = glslang::TQualifier::isSpirvByReference((TQualifier *)CONCAT44(extraout_var,iVar3));
    local_39 = true;
    if (!bVar1) {
      iVar3 = (*paramType->_vptr_TType[7])();
      local_3a = iVar3 == 0x10 && qualifier == EvqBuffer;
      local_39 = local_3a;
    }
    return local_39;
  }
  iVar3 = (*paramType->_vptr_TType[7])();
  return iVar3 == 0x10;
}

Assistant:

bool TGlslangToSpvTraverser::originalParam(glslang::TStorageQualifier qualifier, const glslang::TType& paramType,
                                           bool implicitThisParam)
{
    if (implicitThisParam)                                                                     // implicit this
        return true;
    if (glslangIntermediate->getSource() == glslang::EShSourceHlsl)
        return paramType.getBasicType() == glslang::EbtBlock;
    return (paramType.containsOpaque() && !glslangIntermediate->getBindlessMode()) ||       // sampler, etc.
           paramType.getQualifier().isSpirvByReference() ||                                    // spirv_by_reference
           (paramType.getBasicType() == glslang::EbtBlock && qualifier == glslang::EvqBuffer); // SSBO
}